

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O0

int __thiscall imrt::Station::getMaxIntensityRow(Station *this,int i)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  double dVar2;
  int j;
  int max;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = -1;
  local_14 = 0;
  while( true ) {
    iVar1 = maths::Matrix::nb_cols((Matrix *)(in_RDI + 0xb8));
    if (iVar1 <= local_14) break;
    dVar2 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),in_ESI,local_14);
    if ((double)local_10 < dVar2) {
      dVar2 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),in_ESI,local_14);
      local_10 = (int)dVar2;
    }
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

int getMaxIntensityRow(int i) const{
    int max=-1;
    for(int j=0;j<I.nb_cols();j++){
      if(I(i,j)>max)
        max=I(i,j);
    }
    return max;
  }